

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

void VulkanUtilities::SetObjectTag
               (VkDevice device,uint64_t objectHandle,VkObjectType objectType,uint64_t name,
               size_t tagSize,void *tag)

{
  undefined4 local_70 [2];
  VkDebugUtilsObjectTagInfoEXT tagInfo;
  void *tag_local;
  size_t tagSize_local;
  uint64_t name_local;
  VkObjectType objectType_local;
  uint64_t objectHandle_local;
  VkDevice device_local;
  
  if ((anonymous_namespace)::SetDebugUtilsObjectTagEXT != (code *)0x0) {
    tagInfo.pTag = tag;
    memset(local_70,0,0x38);
    local_70[0] = 0x3b9cbe01;
    tagInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    tagInfo._4_4_ = 0;
    tagInfo.tagSize = (size_t)tagInfo.pTag;
    tagInfo.pNext._0_4_ = objectType;
    tagInfo._16_8_ = objectHandle;
    tagInfo.objectHandle = name;
    tagInfo.tagName = tagSize;
    (*(anonymous_namespace)::SetDebugUtilsObjectTagEXT)(device,local_70);
  }
  return;
}

Assistant:

void SetObjectTag(VkDevice device, uint64_t objectHandle, VkObjectType objectType, uint64_t name, size_t tagSize, const void* tag)
{
    // Check for valid function pointer (may not be present if not running in a debugging application)
    if (SetDebugUtilsObjectTagEXT == nullptr)
        return;

    VkDebugUtilsObjectTagInfoEXT tagInfo{};
    tagInfo.sType        = VK_STRUCTURE_TYPE_DEBUG_UTILS_OBJECT_TAG_INFO_EXT;
    tagInfo.pNext        = nullptr;
    tagInfo.objectType   = objectType;
    tagInfo.objectHandle = objectHandle;
    tagInfo.tagName      = name;
    tagInfo.tagSize      = tagSize;
    tagInfo.pTag         = tag;
    SetDebugUtilsObjectTagEXT(device, &tagInfo);
}